

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getSourceFileName_abi_cxx11_(ApprovalTestNamer *this)

{
  string *psVar1;
  long lVar2;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  size_type end;
  size_type start;
  string file;
  TestName *in_stack_ffffffffffffff40;
  string *this_00;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  string local_58 [32];
  long local_38;
  string local_30 [48];
  
  getCurrentTest();
  psVar1 = TestName::getFileName_abi_cxx11_(in_stack_ffffffffffffff40);
  ::std::__cxx11::string::string(local_30,(string *)psVar1);
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  this_00 = local_58;
  lVar2 = ::std::__cxx11::string::rfind(local_30,(ulong)this_00);
  ::std::__cxx11::string::~string(this_00);
  local_38 = lVar2 + 1;
  ::std::__cxx11::string::rfind((char)local_30,0x2e);
  ::std::__cxx11::string::substr((ulong)local_90,(ulong)local_30);
  convertToFileName(in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getSourceFileName() const
    {
        auto file = getCurrentTest().getFileName();
        auto start = file.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto end = file.rfind('.');
        auto fileName = file.substr(start, end - start);
        return convertToFileName(fileName);
    }